

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O0

BOOL __thiscall
Js::JavascriptStackWalker::Walk(JavascriptStackWalker *this,bool includeInlineFrames)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JavascriptFunction *function;
  void *addressOfReturnAddress;
  byte local_29;
  BOOL hasCaller;
  bool includeInlineFrames_local;
  JavascriptStackWalker *this_local;
  
  this->interpreterFrame = (InterpreterStackFrame *)0x0;
  if (((this->lastInternalFrameInfo).codeAddress != (void *)0x0) &&
     ((*(ushort *)&this->field_0x50 >> 7 & 1) != 0)) {
    *(ushort *)&this->field_0x50 = *(ushort *)&this->field_0x50 & 0xff7f;
    ClearCachedInternalFrameInfo(this);
  }
  if ((*(ushort *)&this->field_0x50 & 1) == 0) {
    *(ushort *)&this->field_0x50 = *(ushort *)&this->field_0x50 & 0xfffd;
    if ((*(ushort *)&this->field_0x50 >> 4 & 1) == 0) {
      bVar2 = Amd64StackFrame::Next(&this->currentFrame);
      if (!bVar2) {
        *(ushort *)&this->field_0x50 = *(ushort *)&this->field_0x50 & 0xfffb;
        return 0;
      }
    }
    else {
      *(ushort *)&this->field_0x50 = *(ushort *)&this->field_0x50 & 0xffef;
    }
    addressOfReturnAddress = Amd64StackFrame::GetAddressOfInstructionPointer(&this->currentFrame);
    bVar2 = AlignAndCheckAddressOfReturnAddressMatch
                      (addressOfReturnAddress,
                       this->entryExitRecord->addrOfReturnAddrOfScriptEntryFunction);
    if (bVar2) {
      local_29 = 1;
      if ((undefined1  [56])((undefined1  [56])*this->entryExitRecord & (undefined1  [56])0x1) ==
          (undefined1  [56])0x0) {
        local_29 = (byte)((ushort)*(undefined2 *)&this->field_0x50 >> 8) & 1;
      }
      this->entryExitRecord = this->entryExitRecord->next;
      if (this->entryExitRecord == (ScriptEntryExitRecord *)0x0) {
        *(ushort *)&this->field_0x50 = *(ushort *)&this->field_0x50 & 0xfffb;
        return 0;
      }
      if ((local_29 == 0) &&
         (bVar2 = ScriptContext::IsDiagnosticsScriptContext(this->scriptContext), !bVar2)) {
        *(ushort *)&this->field_0x50 = *(ushort *)&this->field_0x50 & 0xfffb;
        return 0;
      }
      this->scriptContext = this->entryExitRecord->scriptContext;
      Amd64StackFrame::SkipToFrame
                (&this->currentFrame,this->entryExitRecord->frameIdOfScriptExitFunction);
    }
    UpdateFrame(this,includeInlineFrames);
    return 1;
  }
  if (!includeInlineFrames) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                ,0x2d4,"(includeInlineFrames)","includeInlineFrames");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = InlinedFrameWalker::Next(&this->inlinedFrameWalker,&this->inlinedFrameCallInfo);
  *(ushort *)&this->field_0x50 = *(ushort *)&this->field_0x50 & 0xfffe | (ushort)bVar2;
  if ((*(ushort *)&this->field_0x50 & 1) == 0) {
    InlinedFrameWalker::Close(&this->inlinedFrameWalker);
    bVar2 = IsCurrentPhysicalFrameForLoopBody(this);
    if (bVar2) {
      function = GetCurrentFunctionFromPhysicalFrame(this);
      SetCachedInternalFrameInfo
                (this,InternalFrameType_LoopBody,function,true,
                 (bool)((byte)(*(ushort *)&this->field_0x50 >> 6) & 1));
      *(ushort *)&this->field_0x50 = *(ushort *)&this->field_0x50 & 0xfffb;
    }
  }
  return 1;
}

Assistant:

BOOL JavascriptStackWalker::Walk(bool includeInlineFrames)
    {
        // Walk one frame up the call stack.
        this->interpreterFrame = NULL;

#if ENABLE_NATIVE_CODEGEN
        if (lastInternalFrameInfo.codeAddress != nullptr && this->previousInterpreterFrameIsForLoopBody)
        {
            this->previousInterpreterFrameIsForLoopBody = false;
            ClearCachedInternalFrameInfo();
        }

        if (inlinedFramesBeingWalked)
        {
            Assert(includeInlineFrames);
            inlinedFramesBeingWalked = inlinedFrameWalker.Next(inlinedFrameCallInfo);
            if (!inlinedFramesBeingWalked)
            {
                inlinedFrameWalker.Close();
                if ((this->IsCurrentPhysicalFrameForLoopBody()))
                {
                    // Done walking inlined frames in a loop body, cache the native code address now
                    // in order to skip the loop body frame.
                    this->SetCachedInternalFrameInfo(InternalFrameType_LoopBody, this->GetCurrentFunctionFromPhysicalFrame(), true /*hasInlinedFramesOnStack*/, previousInterpreterFrameIsFromBailout);
                    isJavascriptFrame = false;
                }
            }

            return true;
        }
#endif
        this->hasInlinedFramesOnStack = false;
        if (this->isInitialFrame)
        {
            this->isInitialFrame = false; // Only walk initial frame once
        }
        else if (!this->currentFrame.Next())
        {
            this->isJavascriptFrame = false;
            return false;
        }

        // If we're at the entry from a host frame, hop to the frame from which we left the script.
        if (AlignAndCheckAddressOfReturnAddressMatch(this->currentFrame.GetAddressOfInstructionPointer(), this->entryExitRecord->addrOfReturnAddrOfScriptEntryFunction))
        {
            BOOL hasCaller = this->entryExitRecord->hasCaller || this->forceFullWalk;

#ifdef CHECK_STACKWALK_EXCEPTION
            BOOL ignoreStackWalkException = this->entryExitRecord->ignoreStackWalkException;
#endif

            this->entryExitRecord = this->entryExitRecord->next;
            if (this->entryExitRecord == NULL)
            {
                this->isJavascriptFrame = false;
                return false;
            }

            if (!hasCaller && !this->scriptContext->IsDiagnosticsScriptContext())
            {
#ifdef CHECK_STACKWALK_EXCEPTION
                if (!ignoreStackWalkException)
                {
                    AssertMsg(false, "walk pass no caller frame");
                }
#endif
                this->isJavascriptFrame = false;
                return false;
            }

            this->scriptContext = this->entryExitRecord->scriptContext;
            this->currentFrame.SkipToFrame(this->entryExitRecord->frameIdOfScriptExitFunction);
        }

        this->UpdateFrame(includeInlineFrames);
        return true;
    }